

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::mln1p<double>(double x)

{
  int in_EDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  double delta;
  int n;
  double sign;
  double x_to_the_n;
  double y;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  Catch::clara::std::abs(in_EDI);
  if (extraout_XMM0_Qa < 0.03125) {
    local_18 = 0.0;
    local_20 = in_XMM0_Qa * in_XMM0_Qa;
    local_28 = 1.0;
    for (local_2c = 2; local_2c < 0x35; local_2c = local_2c + 1) {
      local_18 = (local_28 * local_20) / (double)local_2c + local_18;
      Catch::clara::std::abs(in_EDI);
      dVar1 = Catch::clara::std::numeric_limits<double>::epsilon();
      if (extraout_XMM0_Qa_00 < dVar1 * 4.0 * local_18) break;
      local_20 = in_XMM0_Qa * local_20;
      local_28 = -local_28;
    }
    local_8 = local_18;
  }
  else {
    local_8 = ln1p(1.55842237349542e-317);
    local_8 = in_XMM0_Qa - local_8;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }